

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::GetChainStarts
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          CrossingProcessor *cp,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *chain_starts)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndex *index;
  bool bVar2;
  int iVar3;
  int iVar4;
  int edge_id;
  undefined4 extraout_var;
  int extraout_var_00;
  S2Point *p;
  bool local_159;
  ShapeEdgeId local_fc;
  byte local_f1;
  undefined1 local_f0 [7];
  bool inside;
  undefined1 local_c0 [8];
  ShapeEdge a;
  Chain chain;
  int chain_id;
  int num_chains;
  S2Shape *a_shape;
  int shape_id;
  S2ContainsPointQueryOptions local_5c;
  int num_shape_ids;
  S2ContainsPointQuery<S2ShapeIndex> query;
  bool b_has_interior;
  S2ShapeIndex *b_index;
  S2ShapeIndex *a_index;
  CrossingProcessor *cp_local;
  bool invert_result_local;
  bool invert_b_local;
  bool invert_a_local;
  int a_region_id_local;
  Impl *this_local;
  S2Shape *a_shape_00;
  
  pSVar1 = this->op_->regions_[a_region_id];
  index = this->op_->regions_[1 - a_region_id];
  bVar2 = is_boolean_output(this);
  if (bVar2) {
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
  }
  query.it_.iter_._M_t.
  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_ =
       HasInterior(index);
  if ((((bool)query.it_.iter_._M_t.
              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
              ._M_t.
              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_) ||
      (invert_b)) || (bVar2 = is_boolean_output(this), bVar2)) {
    S2ContainsPointQueryOptions::S2ContainsPointQueryOptions(&local_5c);
    MakeS2ContainsPointQuery<S2ShapeIndex>
              ((S2ContainsPointQuery<S2ShapeIndex> *)&num_shape_ids,index,&local_5c);
    iVar3 = (*pSVar1->_vptr_S2ShapeIndex[2])();
    for (a_shape._0_4_ = 0; (int)(uint)a_shape < iVar3; a_shape._0_4_ = (uint)a_shape + 1) {
      iVar4 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)(uint)a_shape);
      a_shape_00 = (S2Shape *)CONCAT44(extraout_var,iVar4);
      if ((a_shape_00 != (S2Shape *)0x0) &&
         ((invert_a == invert_result || (iVar4 = (*a_shape_00->_vptr_S2Shape[4])(), 1 < iVar4)))) {
        bVar2 = is_boolean_output(this);
        if (bVar2) {
          CrossingProcessor::StartShape(cp,a_shape_00);
        }
        iVar4 = (*a_shape_00->_vptr_S2Shape[6])();
        for (chain.start = 0; chain.start < iVar4; chain.start = chain.start + 1) {
          edge_id = (*a_shape_00->_vptr_S2Shape[7])(a_shape_00,(ulong)(uint)chain.start);
          a.edge_.v1.c_[2] = (VType)CONCAT44(extraout_var_00,edge_id);
          if (extraout_var_00 != 0) {
            (*a_shape_00->_vptr_S2Shape[8])(local_f0,a_shape_00,(ulong)(uint)chain.start,0);
            s2shapeutil::ShapeEdge::ShapeEdge
                      ((ShapeEdge *)local_c0,(uint)a_shape,edge_id,(Edge *)local_f0);
            local_159 = false;
            if ((query.it_.iter_._M_t.
                 super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                 .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl._7_1_ & 1)
                != 0) {
              p = s2shapeutil::ShapeEdge::v0((ShapeEdge *)local_c0);
              local_159 = S2ContainsPointQuery<S2ShapeIndex>::Contains
                                    ((S2ContainsPointQuery<S2ShapeIndex> *)&num_shape_ids,p);
            }
            local_f1 = local_159 != invert_b;
            if ((bool)local_f1) {
              s2shapeutil::ShapeEdgeId::ShapeEdgeId(&local_fc,(uint)a_shape,a.edge_.v1.c_[2]._0_4_);
              std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::
              push_back(chain_starts,&local_fc);
            }
            bVar2 = is_boolean_output(this);
            if (bVar2) {
              CrossingProcessor::StartChain
                        (cp,chain.start,(Chain)a.edge_.v1.c_[2],(bool)(local_f1 & 1));
              bVar2 = ProcessIncidentEdges
                                (this,(ShapeEdge *)local_c0,
                                 (S2ContainsPointQuery<S2ShapeIndex> *)&num_shape_ids,cp);
              if (!bVar2) {
                this_local._7_1_ = 0;
                bVar2 = true;
                goto LAB_003a9295;
              }
            }
          }
        }
      }
    }
    bVar2 = false;
LAB_003a9295:
    S2ContainsPointQuery<S2ShapeIndex>::~S2ContainsPointQuery
              ((S2ContainsPointQuery<S2ShapeIndex> *)&num_shape_ids);
    if (bVar2) goto LAB_003a92c2;
  }
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::push_back
            (chain_starts,&kSentinel);
  this_local._7_1_ = 1;
LAB_003a92c2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool S2BooleanOperation::Impl::GetChainStarts(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    CrossingProcessor* cp, vector<ShapeEdgeId>* chain_starts) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];

  if (is_boolean_output()) {
    // If boolean output is requested, then we use the CrossingProcessor to
    // determine whether the first edge of each chain will be emitted to the
    // output region.  This lets us terminate the operation early in many
    // cases.
    cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);
  }

  // If region B has no two-dimensional shapes and is not inverted, then by
  // definition no chain starts are contained.  However if boolean output is
  // requested then we check for containment anyway, since as a side effect we
  // may discover that the result region is non-empty and terminate the entire
  // operation early.
  bool b_has_interior = HasInterior(b_index);
  if (b_has_interior || invert_b || is_boolean_output()) {
    auto query = MakeS2ContainsPointQuery(&b_index);
    int num_shape_ids = a_index.num_shape_ids();
    for (int shape_id = 0; shape_id < num_shape_ids; ++shape_id) {
      S2Shape* a_shape = a_index.shape(shape_id);
      if (a_shape == nullptr) continue;

      // If region A is being subtracted from region B, points and polylines
      // in region A can be ignored since these shapes never contribute to the
      // output (they can only remove edges from region B).
      if (invert_a != invert_result && a_shape->dimension() < 2) continue;

      if (is_boolean_output()) cp->StartShape(a_shape);
      int num_chains = a_shape->num_chains();
      for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
        S2Shape::Chain chain = a_shape->chain(chain_id);
        if (chain.length == 0) continue;
        ShapeEdge a(shape_id, chain.start, a_shape->chain_edge(chain_id, 0));
        bool inside = (b_has_interior && query.Contains(a.v0())) != invert_b;
        if (inside) {
          chain_starts->push_back(ShapeEdgeId(shape_id, chain.start));
        }
        if (is_boolean_output()) {
          cp->StartChain(chain_id, chain, inside);
          if (!ProcessIncidentEdges(a, &query, cp)) return false;
        }
      }
    }
  }
  chain_starts->push_back(kSentinel);
  return true;
}